

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

void __thiscall HEkkPrimal::computePrimalSteepestEdgeWeights(HEkkPrimal *this)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  long *in_RDI;
  HighsInt iRow;
  HighsInt iVar;
  HVector local_col_aq;
  HighsInt iEl;
  HighsInt iCol;
  HighsSparseMatrix *a_matrix;
  HighsInt report_var;
  undefined4 in_stack_fffffffffffffee0;
  uint in_stack_fffffffffffffee4;
  HEkk *in_stack_fffffffffffffee8;
  HEkkPrimal *this_00;
  size_type in_stack_fffffffffffffef8;
  value_type vVar6;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff00;
  value_type vVar7;
  uint local_e4;
  int local_e0;
  undefined1 local_d0 [176];
  int local_20;
  int local_1c;
  pointer local_18;
  undefined4 local_c;
  
  local_c = 0xfffffff0;
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  bVar2 = HEkk::logicalBasis(in_stack_fffffffffffffee8);
  if (bVar2) {
    local_18 = (pointer)(*in_RDI + 0x2218);
    for (local_1c = 0; local_1c < (int)in_RDI[2]; local_1c = local_1c + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x18),(long)local_1c)
      ;
      *pvVar5 = 1.0;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_18 + 1),(long)local_1c);
      for (local_20 = *pvVar3; iVar1 = local_20,
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(local_18 + 1),
                              (long)(local_1c + 1)), iVar1 < *pvVar3; local_20 = local_20 + 1) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&local_18[5].second,
                            (long)local_20);
        vVar6 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&local_18[5].second,
                            (long)local_20);
        vVar7 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x18),
                            (long)local_1c);
        *pvVar5 = vVar6 * vVar7 + *pvVar5;
      }
    }
  }
  else {
    this_00 = (HEkkPrimal *)local_d0;
    HVectorBase<double>::HVectorBase
              ((HVectorBase<double> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0))
    ;
    HVectorBase<double>::setup
              ((HVectorBase<double> *)this_00,(HighsInt)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    for (local_e0 = 0; local_e0 < (int)in_RDI[3]; local_e0 = local_e0 + 1) {
      pvVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)(*in_RDI + 0x2990),
                          (long)local_e0);
      if (*pvVar4 != '\0') {
        in_stack_fffffffffffffee8 =
             (HEkk *)computePrimalSteepestEdgeWeight
                               (this_00,(HighsInt)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                                (HVector *)
                                CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x18),
                            (long)local_e0);
        *pvVar5 = (value_type)in_stack_fffffffffffffee8;
        if (local_e0 == -0x10) {
          printf("Tableau column %d\nRow       Value\n",0xfffffff0);
          for (local_e4 = 0; (int)local_e4 < *(int *)((long)in_RDI + 0x14); local_e4 = local_e4 + 1)
          {
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(local_d0 + 0x20),
                                (long)(int)local_e4);
            if ((*pvVar5 != 0.0) || (NAN(*pvVar5))) {
              in_stack_fffffffffffffee4 = local_e4;
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(local_d0 + 0x20),
                                  (long)(int)local_e4);
              printf("%3d  %10.7g\n",*pvVar5,(ulong)in_stack_fffffffffffffee4);
            }
          }
        }
      }
    }
    HVectorBase<double>::~HVectorBase
              ((HVectorBase<double> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0))
    ;
  }
  return;
}

Assistant:

void HEkkPrimal::computePrimalSteepestEdgeWeights() {
  const HighsInt report_var = -16;
  edge_weight_.resize(num_tot);
  if (ekk_instance_.logicalBasis()) {
    HighsSparseMatrix& a_matrix = ekk_instance_.lp_.a_matrix_;
    for (HighsInt iCol = 0; iCol < num_col; iCol++) {
      edge_weight_[iCol] = 1;
      for (HighsInt iEl = a_matrix.start_[iCol];
           iEl < a_matrix.start_[iCol + 1]; iEl++)
        edge_weight_[iCol] += a_matrix.value_[iEl] * a_matrix.value_[iEl];
    }
  } else {
    HVector local_col_aq;
    local_col_aq.setup(num_row);
    for (HighsInt iVar = 0; iVar < num_tot; iVar++) {
      if (ekk_instance_.basis_.nonbasicFlag_[iVar]) {
        edge_weight_[iVar] =
            computePrimalSteepestEdgeWeight(iVar, local_col_aq);
        if (iVar == report_var) {
          printf("Tableau column %d\nRow       Value\n", (int)report_var);
          for (HighsInt iRow = 0; iRow < num_row; iRow++) {
            if (local_col_aq.array[iRow])
              printf("%3d  %10.7g\n", (int)iRow, local_col_aq.array[iRow]);
          }
        }
      }
    }
  }
}